

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O2

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
               (unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  size_t __c;
  __node_ptr p_Var4;
  __node_ptr p_Var5;
  __buckets_ptr pp_Var6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  size_type __bkt_count;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  undefined1 auVar11 [16];
  _Scoped_node local_58;
  pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>
  local_48;
  
  local_48.first.first = key->first;
  local_48.first.second = key->second;
  local_48.second = *value;
  __c = anon_unknown_1::PointerStringPairHash::operator()((PointerStringPairHash *)&local_48,key);
  uVar8 = __c % (collection->_M_h)._M_bucket_count;
  p_Var4 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&collection->_M_h,uVar8,&local_48.first,__c);
  if (p_Var4 == (__node_ptr)0x0) {
    p_Var5 = std::__detail::
             _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>,true>>>
             ::
             _M_allocate_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>const&>
                       ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>,true>>>
                         *)collection,&local_48);
    local_58._M_h = (__hashtable_alloc *)collection;
    local_58._M_node = p_Var5;
    auVar11 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(collection->_M_h)._M_rehash_policy,
                         (collection->_M_h)._M_bucket_count,(collection->_M_h)._M_element_count);
    __bkt_count = auVar11._8_8_;
    if ((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var6 = (collection->_M_h)._M_buckets;
    }
    else {
      pp_Var6 = std::
                _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_allocate_buckets(&collection->_M_h,__bkt_count);
      p_Var1 = &(collection->_M_h)._M_before_begin;
      p_Var3 = (collection->_M_h)._M_before_begin._M_nxt;
      (collection->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      uVar8 = 0;
LAB_0029b021:
      p_Var10 = p_Var3;
      uVar9 = uVar8;
      if (p_Var10 != (_Hash_node_base *)0x0) {
        p_Var3 = p_Var10->_M_nxt;
        uVar8 = (ulong)p_Var10[4]._M_nxt % __bkt_count;
        if (pp_Var6[uVar8] == (__node_base_ptr)0x0) goto LAB_0029b052;
        p_Var10->_M_nxt = pp_Var6[uVar8]->_M_nxt;
        p_Var7 = pp_Var6[uVar8];
        uVar8 = uVar9;
        goto LAB_0029b071;
      }
      std::
      _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_deallocate_buckets(&collection->_M_h);
      (collection->_M_h)._M_bucket_count = __bkt_count;
      (collection->_M_h)._M_buckets = pp_Var6;
      uVar8 = __c % __bkt_count;
    }
    (p_Var5->
    super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = __c;
    if (pp_Var6[uVar8] == (__node_base_ptr)0x0) {
      (p_Var5->super__Hash_node_base)._M_nxt = (collection->_M_h)._M_before_begin._M_nxt;
      (collection->_M_h)._M_before_begin._M_nxt = &p_Var5->super__Hash_node_base;
      p_Var3 = (p_Var5->super__Hash_node_base)._M_nxt;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        pp_Var6[(ulong)p_Var3[4]._M_nxt % (collection->_M_h)._M_bucket_count] =
             &p_Var5->super__Hash_node_base;
        pp_Var6 = (collection->_M_h)._M_buckets;
      }
      pp_Var6[uVar8] = &(collection->_M_h)._M_before_begin;
    }
    else {
      (p_Var5->super__Hash_node_base)._M_nxt = pp_Var6[uVar8]->_M_nxt;
      pp_Var6[uVar8]->_M_nxt = &p_Var5->super__Hash_node_base;
    }
    psVar2 = &(collection->_M_h)._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_58._M_node = (__node_ptr)0x0;
    std::
    _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node(&local_58);
  }
  return p_Var4 == (__node_ptr)0x0;
LAB_0029b052:
  p_Var10->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = p_Var10;
  pp_Var6[uVar8] = p_Var1;
  if (p_Var10->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (__node_base_ptr)(pp_Var6 + uVar9);
LAB_0029b071:
    p_Var7->_M_nxt = p_Var10;
  }
  goto LAB_0029b021;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}